

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_componentWithImport_Test::TestBody(Clone_componentWithImport_Test *this)

{
  string *psVar1;
  ComponentPtr cClone;
  ComponentPtr c;
  ImportSourcePtr import;
  string asStack_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [3];
  string *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  string *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  libcellml::Component::create();
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_58,"some-other-model.xml",(allocator<char> *)&local_28);
  libcellml::ImportSource::setUrl(local_18);
  std::__cxx11::string::~string(asStack_58);
  psVar1 = local_38;
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_58,"unique",(allocator<char> *)&local_28);
  libcellml::Entity::setId(psVar1);
  std::__cxx11::string::~string(asStack_58);
  psVar1 = local_38;
  std::__cxx11::string::string<std::allocator<char>>(asStack_58,"copy",(allocator<char> *)&local_28)
  ;
  libcellml::NamedEntity::setName(psVar1);
  std::__cxx11::string::~string(asStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_58,"imported_component_name",(allocator<char> *)&local_28);
  libcellml::Component::setSourceComponent((shared_ptr *)local_38,(string *)&local_18);
  std::__cxx11::string::~string(asStack_58);
  libcellml::Component::clone();
  local_28 = 0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  compareComponent((shared_ptr *)&local_38,(shared_ptr *)asStack_58,(shared_ptr *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

TEST(Clone, componentWithImport)
{
    auto c = libcellml::Component::create();
    auto import = libcellml::ImportSource::create();
    import->setUrl("some-other-model.xml");

    c->setId("unique");
    c->setName("copy");
    c->setSourceComponent(import, "imported_component_name");

    auto cClone = c->clone();

    compareComponent(c, cClone);
}